

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flies.cpp
# Opt level: O3

int AF_A_FlyBuzz(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AActor *pAVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  AActor *other;
  char *__assertion;
  bool bVar9;
  FSoundID local_5c;
  double local_58;
  double dStack_50;
  DVector2 local_48;
  TAngle<double> local_38;
  DObject *pDStack_30;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005df4de;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005df4ce;
  other = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_005df22b;
    pPVar8 = (other->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar5 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar5);
      (other->super_DThinker).super_DObject.Class = pPVar8;
    }
    bVar9 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar4 && bVar9) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar9 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar4) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (!bVar9) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005df4de;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_005df4ce;
LAB_005df22b:
    other = (AActor *)0x0;
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005df4ce:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005df4de;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar8 = (PClass *)puVar2[1];
          if (pPVar8 == (PClass *)0x0) {
            pPVar8 = (PClass *)(**(code **)*puVar2)(puVar2);
            puVar2[1] = pPVar8;
          }
          bVar9 = pPVar8 != (PClass *)0x0;
          if (pPVar8 != pPVar4 && bVar9) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar9 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar4) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if (!bVar9) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005df4de;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005df4ce;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005df4de:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                    ,0x4d,"int AF_A_FlyBuzz(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  pAVar3 = (other->target).field_0.p;
  if (pAVar3 != (AActor *)0x0) {
    if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (((pAVar3->flags).Value & 0x100000) != 0) {
        uVar6 = FRandom::GenRand32(&pr_fly);
        if (4 < (uVar6 & 0xff)) {
          AActor::AngleTo((AActor *)&local_48,other,SUB81(pAVar3,0));
          (other->Angles).Yaw.Degrees = local_48.X;
          other->args[0] = other->args[0] + 1;
          local_58 = (other->__Pos).X;
          dStack_50 = (other->__Pos).Y;
          TAngle<double>::ToVector(&stack0xffffffffffffffc8,6.0);
          local_48.Y._0_4_ = SUB84(dStack_50 + (double)pDStack_30,0);
          local_48.X = local_58 + local_38.Degrees;
          local_48.Y._4_4_ = (int)((ulong)(dStack_50 + (double)pDStack_30) >> 0x20);
          bVar9 = P_TryMove(other,&local_48,1,(secplane_t *)0x0);
          if (bVar9) {
            if ((other->args[0] & 2) != 0) {
              uVar6 = FRandom::GenRand32(&pr_fly);
              (other->Vel).X = (double)(int)((uVar6 & 0xff) - 0x80) * 0.001953125 + (other->Vel).X;
              uVar6 = FRandom::GenRand32(&pr_fly);
              (other->Vel).Y = (double)(int)((uVar6 & 0xff) - 0x80) * 0.001953125 + (other->Vel).Y;
            }
            uVar7 = FRandom::GenRand32(&pr_fly);
            uVar7 = uVar7 & 0xff;
            uVar6 = -uVar7;
            if ((other->__Pos).Z <= (pAVar3->__Pos).Z + 5.0) {
              uVar6 = uVar7;
            }
            if (uVar7 < 0x97) {
              uVar6 = uVar7;
            }
            (other->Vel).Z = (double)(int)uVar6 * 0.001953125;
            uVar6 = FRandom::GenRand32(&pr_fly);
            if (0x27 < (uVar6 & 0xf8)) {
              return 0;
            }
            local_5c.ID = (other->ActiveSound).super_FSoundID.ID;
            S_Sound(other,2,&local_5c,0.5,3.0);
            return 0;
          }
          bVar9 = true;
          goto LAB_005df4b0;
        }
      }
    }
    else {
      (other->target).field_0.p = (AActor *)0x0;
    }
  }
  bVar9 = false;
LAB_005df4b0:
  AActor::SetIdle(other,bVar9);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FlyBuzz)
{
	PARAM_ACTION_PROLOGUE;

	AActor *targ = self->target;

	if (targ == NULL || !(targ->flags & MF_CORPSE) || pr_fly() < 5)
	{
		self->SetIdle();
		return 0;
	}

	self->Angles.Yaw = self->AngleTo(targ);
	self->args[0]++;
	if (!P_TryMove(self, self->Pos().XY() + self->Angles.Yaw.ToVector(6), true))
	{
		self->SetIdle(true);
		return 0;
	}
	if (self->args[0] & 2)
	{
		self->Vel.X += (pr_fly() - 128) / 512.;
		self->Vel.Y += (pr_fly() - 128) / 512.;
	}
	int zrand = pr_fly();
	if (targ->Z() + 5. < self->Z() && zrand > 150)
	{
		zrand = -zrand;
	}
	self->Vel.Z = zrand / 512.;
	if (pr_fly() < 40)
	{
		S_Sound(self, CHAN_VOICE, self->ActiveSound, 0.5f, ATTN_STATIC);
	}
	return 0;
}